

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRasterizationTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles2::Functional::anon_unknown_1::BaseLineCase::iterate(BaseLineCase *this)

{
  size_type *psVar1;
  size_t **ppsVar2;
  undefined1 auVar3 [8];
  pointer pSVar4;
  pointer pSVar5;
  bool bVar6;
  int iVar7;
  long *plVar8;
  undefined8 *puVar9;
  undefined4 extraout_var;
  RenderTarget *pRVar10;
  pointer pVVar11;
  ulong *puVar12;
  char *description;
  IterateResult IVar13;
  qpTestResult testResult;
  ulong uVar14;
  ulong uVar15;
  char *pcVar16;
  Surface resultImage;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  string iterationDescription;
  ScopedLogSection section;
  float range [2];
  pointer local_248;
  pointer pSStack_240;
  pointer local_238 [2];
  Surface local_228;
  long lStack_210;
  undefined1 local_208 [24];
  long lStack_1f0;
  RasterizationArguments local_1e0;
  undefined4 uStack_1cc;
  string local_1c0;
  ScopedLogSection local_1a0;
  undefined1 local_198 [8];
  pointer pSStack_190;
  pointer local_188;
  float local_180;
  ios_base local_128 [264];
  
  iVar7 = this->m_iteration;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::ostream::operator<<((ostringstream *)local_198,iVar7 + 1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_248,0,(char *)0x0,0x6413d0);
  pVVar11 = (pointer)(plVar8 + 2);
  if ((pointer)*plVar8 == pVVar11) {
    local_208._16_8_ = *(undefined8 *)pVVar11->m_data;
    lStack_1f0 = plVar8[3];
    local_208._0_8_ = (pointer)(local_208 + 0x10);
  }
  else {
    local_208._16_8_ = *(undefined8 *)pVVar11->m_data;
    local_208._0_8_ = (pointer)*plVar8;
  }
  local_208._8_8_ = plVar8[1];
  *plVar8 = (long)pVVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append(local_208);
  ppsVar2 = (size_t **)&local_228.m_pixels.m_cap;
  puVar12 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar12) {
    local_228.m_pixels.m_cap = *puVar12;
    lStack_210 = plVar8[3];
    local_228._0_8_ = ppsVar2;
  }
  else {
    local_228.m_pixels.m_cap = *puVar12;
    local_228._0_8_ = (ulong *)*plVar8;
  }
  local_228.m_pixels.m_ptr = (void *)plVar8[1];
  *plVar8 = (long)puVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::ostream::operator<<(local_198,this->m_iterationCount);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  uVar14 = CONCAT44(local_1e0.greenBits,local_1e0.redBits) + (long)local_228.m_pixels.m_ptr;
  uVar15 = 0xf;
  if ((size_t **)local_228._0_8_ != ppsVar2) {
    uVar15 = local_228.m_pixels.m_cap;
  }
  if (uVar15 < uVar14) {
    uVar15 = 0xf;
    if ((void *)local_1e0._0_8_ != (void *)((long)&local_1e0 + 0x10U)) {
      uVar15 = CONCAT44(uStack_1cc,local_1e0.blueBits);
    }
    if (uVar14 <= uVar15) {
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1e0,0,(char *)0x0,local_228._0_8_);
      goto LAB_00359632;
    }
  }
  puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_228,local_1e0._0_8_);
LAB_00359632:
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  psVar1 = puVar9 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_1c0.field_2._M_allocated_capacity = *psVar1;
    local_1c0.field_2._8_8_ = puVar9[3];
  }
  else {
    local_1c0.field_2._M_allocated_capacity = *psVar1;
    local_1c0._M_dataplus._M_p = (pointer)*puVar9;
  }
  local_1c0._M_string_length = puVar9[1];
  *puVar9 = psVar1;
  puVar9[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((void *)local_1e0._0_8_ != (void *)((long)&local_1e0 + 0x10U)) {
    operator_delete((void *)local_1e0._0_8_,CONCAT44(uStack_1cc,local_1e0.blueBits) + 1);
  }
  if ((size_t **)local_228._0_8_ != ppsVar2) {
    operator_delete((void *)local_228._0_8_,local_228.m_pixels.m_cap + 1);
  }
  if ((pointer)local_208._0_8_ != (pointer)(local_208 + 0x10)) {
    operator_delete((void *)local_208._0_8_,(ulong)((long)(float *)local_208._16_8_ + 1));
  }
  if (local_248 != (pointer)local_238) {
    operator_delete(local_248,(long)local_238[0] + 1);
  }
  tcu::ScopedLogSection::ScopedLogSection
            (&local_1a0,
             ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
             )->m_log,&local_1c0,&local_1c0);
  iVar7 = (this->super_BaseRenderingCase).m_renderSize;
  tcu::Surface::Surface(&local_228,iVar7,iVar7);
  local_208._0_8_ = (pointer)0x0;
  local_208._8_8_ = (pointer)0x0;
  local_208._16_8_ = (pointer)0x0;
  local_238[0] = (pointer)0x0;
  local_248 = (pointer)0x0;
  pSStack_240 = (pointer)0x0;
  uVar14 = (ulong)(uint)this->m_iteration;
  if ((this->m_primitiveWideness == PRIMITIVEWIDENESS_WIDE) &&
     (this->m_iteration + 1U == this->m_iterationCount)) {
    local_198 = (undefined1  [8])0x0;
    iVar7 = (*((this->super_BaseRenderingCase).super_TestCase.m_context)->m_renderCtx->
              _vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar7) + 0x818))(0x846e,local_198);
    (this->super_BaseRenderingCase).m_lineWidth = (float)local_198._4_4_;
    uVar14 = (ulong)(uint)this->m_iteration;
  }
  (*(this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[5])
            (this,uVar14,local_208,&local_248);
  BaseRenderingCase::drawPrimitives
            (&this->super_BaseRenderingCase,&local_228,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_208,
             this->m_primitiveDrawType);
  local_198 = (undefined1  [8])0x0;
  pSStack_190 = (pointer)0x0;
  local_188 = (pointer)0x0;
  local_1e0.numSamples = (this->super_BaseRenderingCase).m_numSamples;
  local_1e0.subpixelBits = (this->super_BaseRenderingCase).m_subpixelBits;
  pRVar10 = Context::getRenderTarget((this->super_BaseRenderingCase).super_TestCase.m_context);
  local_1e0.redBits = (pRVar10->m_pixelFormat).redBits;
  pRVar10 = Context::getRenderTarget((this->super_BaseRenderingCase).super_TestCase.m_context);
  local_1e0.greenBits = (pRVar10->m_pixelFormat).greenBits;
  pRVar10 = Context::getRenderTarget((this->super_BaseRenderingCase).super_TestCase.m_context);
  pSVar5 = local_188;
  pSVar4 = pSStack_190;
  auVar3 = local_198;
  local_1e0.blueBits = (pRVar10->m_pixelFormat).blueBits;
  local_188 = local_238[0];
  local_198 = (undefined1  [8])local_248;
  pSStack_190 = pSStack_240;
  local_248 = (pointer)auVar3;
  pSStack_240 = pSVar4;
  local_238[0] = pSVar5;
  local_180 = (this->super_BaseRenderingCase).m_lineWidth;
  bVar6 = tcu::verifyLineGroupRasterization
                    (&local_228,(LineSceneSpec *)local_198,&local_1e0,
                     ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx)->m_log);
  if (((this->super_BaseRenderingCase).m_numSamples < 2 || bVar6) || local_180 == 1.0) {
    if (!bVar6) {
      this->m_allIterationsPassed = false;
    }
  }
  else {
    this->m_multisampleRelaxationRequired = true;
  }
  if (local_198 != (undefined1  [8])0x0) {
    operator_delete((void *)local_198,(long)local_188 - (long)local_198);
  }
  iVar7 = this->m_iteration + 1;
  this->m_iteration = iVar7;
  IVar13 = CONTINUE;
  if (iVar7 == this->m_iterationCount) {
    pcVar16 = "Pass";
    if ((this->m_multisampleRelaxationRequired & 1U) != 0) {
      pcVar16 = "Rasterization of multisampled wide lines failed";
    }
    bVar6 = this->m_allIterationsPassed != false;
    testResult = QP_TEST_RESULT_FAIL;
    if (bVar6) {
      testResult = (this->m_multisampleRelaxationRequired & 1) * 3;
    }
    description = "Incorrect rasterization";
    if (bVar6) {
      description = pcVar16;
    }
    IVar13 = STOP;
    tcu::TestContext::setTestResult
              ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,testResult,description);
  }
  if (local_248 != (pointer)0x0) {
    operator_delete(local_248,(long)local_238[0] - (long)local_248);
  }
  if ((pointer)local_208._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_208._0_8_,local_208._16_8_ - local_208._0_8_);
  }
  tcu::Surface::~Surface(&local_228);
  tcu::TestLog::endSection(local_1a0.m_log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  return IVar13;
}

Assistant:

BaseLineCase::IterateResult BaseLineCase::iterate (void)
{
	const std::string						iterationDescription	= "Test iteration " + de::toString(m_iteration+1) + " / " + de::toString(m_iterationCount);
	const tcu::ScopedLogSection				section					(m_testCtx.getLog(), iterationDescription, iterationDescription);
	tcu::Surface							resultImage				(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>					drawBuffer;
	std::vector<LineSceneSpec::SceneLine>	lines;

	// last iteration, max out size
	if (m_primitiveWideness == PRIMITIVEWIDENESS_WIDE &&
		m_iteration+1 == m_iterationCount)
	{
		float range[2] = { 0.0f, 0.0f };
		m_context.getRenderContext().getFunctions().getFloatv(GL_ALIASED_LINE_WIDTH_RANGE, range);

		m_lineWidth = range[1];
	}

	// gen data
	generateLines(m_iteration, drawBuffer, lines);

	// draw image
	drawPrimitives(resultImage, drawBuffer, m_primitiveDrawType);

	// compare
	{
		bool					compareOk;
		RasterizationArguments	args;
		LineSceneSpec			scene;

		args.numSamples		= m_numSamples;
		args.subpixelBits	= m_subpixelBits;
		args.redBits		= m_context.getRenderTarget().getPixelFormat().redBits;
		args.greenBits		= m_context.getRenderTarget().getPixelFormat().greenBits;
		args.blueBits		= m_context.getRenderTarget().getPixelFormat().blueBits;

		scene.lines.swap(lines);
		scene.lineWidth = m_lineWidth;

		compareOk = verifyLineGroupRasterization(resultImage, scene, args, m_testCtx.getLog());

		// multisampled wide lines might not be supported
		if (scene.lineWidth != 1.0f && m_numSamples > 1 && !compareOk)
		{
			m_multisampleRelaxationRequired = true;
			compareOk = true;
		}

		if (!compareOk)
			m_allIterationsPassed = false;
	}

	// result
	if (++m_iteration == m_iterationCount)
	{
		if (m_allIterationsPassed && m_multisampleRelaxationRequired)
			m_testCtx.setTestResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Rasterization of multisampled wide lines failed");
		else if (m_allIterationsPassed)
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Incorrect rasterization");

		return STOP;
	}
	else
		return CONTINUE;
}